

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall
Fossilize::DatabaseInterface::DatabaseInterface(DatabaseInterface *this,DatabaseMode mode)

{
  Impl *pIVar1;
  __node_base_ptr *pp_Var2;
  long lVar3;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_003a8660;
  pIVar1 = (Impl *)operator_new(0x290);
  (pIVar1->whitelist)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (pIVar1->blacklist)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (pIVar1->sub_databases_in_whitelist).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pIVar1->sub_databases_in_whitelist).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pIVar1->sub_databases_in_whitelist).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pp_Var2 = &pIVar1->implicit_whitelisted[0]._M_h._M_single_bucket;
  lVar3 = 0x230;
  do {
    ((_Hashtable *)(pp_Var2 + -6))->_M_buckets = pp_Var2;
    pp_Var2[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var2 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var2[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var2 + -2))->_M_max_load_factor = 1.0;
    pp_Var2[-1] = (__node_base_ptr)0x0;
    *pp_Var2 = (__node_base_ptr)0x0;
    pp_Var2 = pp_Var2 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  pIVar1->whitelist_tag_mask = 0xd0;
  pIVar1->imported_concurrent_metadata = (ExportedMetadataHeader *)0x0;
  (pIVar1->imported_metadata).
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->imported_metadata).
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->imported_metadata).
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar1->mapped_metadata = (uint8_t *)0x0;
  pIVar1->mapped_metadata_size = 0;
  this->impl = pIVar1;
  pIVar1->mode = mode;
  return;
}

Assistant:

DatabaseInterface::DatabaseInterface(DatabaseMode mode)
{
	impl = new Impl;
	impl->mode = mode;
}